

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::LE_Detonation_PDU::SetEventID(LE_Detonation_PDU *this,LE_EntityIdentifier *ID)

{
  KUINT8 KVar1;
  KUINT8 KVar2;
  LE_EntityIdentifier *ID_local;
  LE_Detonation_PDU *this_local;
  
  SetEventNumberIncludedFlag(this,true);
  DATA_TYPE::LE_EntityIdentifier::operator=(&this->m_EventID,ID);
  KVar1 = DATA_TYPE::LE_EntityIdentifier::GetSiteID(&(this->super_LE_Header).m_EntID);
  KVar2 = DATA_TYPE::LE_EntityIdentifier::GetSiteID(ID);
  if (KVar1 == KVar2) {
    KVar1 = DATA_TYPE::LE_EntityIdentifier::GetApplicationID(&(this->super_LE_Header).m_EntID);
    KVar2 = DATA_TYPE::LE_EntityIdentifier::GetApplicationID(ID);
    if (KVar1 == KVar2) {
      SetEventIDSiteAppIncludedFlag(this,false);
      return;
    }
  }
  SetEventIDSiteAppIncludedFlag(this,true);
  return;
}

Assistant:

void LE_Detonation_PDU::SetEventID( const LE_EntityIdentifier & ID )
{
    SetEventNumberIncludedFlag( true );
    m_EventID = ID;

    // Check if the id's site and application values
    // are the same, if they are we don't include them.
    if( m_EntID.GetSiteID() == ID.GetSiteID() &&
            m_EntID.GetApplicationID() == ID.GetApplicationID() )
    {
        // They match so don't include the fields
        SetEventIDSiteAppIncludedFlag( false );
    }
    else
    {
        // They don't match so we need to send these fields.
        SetEventIDSiteAppIncludedFlag( true );
    }
}